

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_ray_tracing.cpp
# Opt level: O0

spv_result_t spvtools::val::RayTracingPass(ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  Op OVar5;
  StorageClass SVar6;
  Function *pFVar7;
  DiagnosticStream *pDVar8;
  DiagnosticStream local_2238;
  DiagnosticStream local_2060;
  Instruction *local_1e88;
  Instruction *callable_data;
  uint32_t local_1ca8;
  anon_class_1_0_00000001 local_1ca1;
  uint32_t sbt_index;
  DiagnosticStream local_1c80;
  uint32_t local_1aa4;
  undefined1 local_1aa0 [4];
  uint32_t hit_kind;
  uint32_t local_18c4;
  undefined1 local_18c0 [4];
  uint32_t hit;
  anon_class_1_0_00000001 local_16e1;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_16e0;
  DiagnosticStream local_16c0;
  DiagnosticStream local_14e8;
  Instruction *local_1310;
  Instruction *payload;
  uint32_t local_112c;
  undefined1 local_1128 [4];
  uint32_t ray_tmax;
  uint32_t local_f4c;
  undefined1 local_f48 [4];
  uint32_t ray_direction;
  uint32_t local_d6c;
  undefined1 local_d68 [4];
  uint32_t ray_tmin;
  uint32_t local_b8c;
  undefined1 local_b88 [4];
  uint32_t ray_origin;
  uint32_t local_9ac;
  undefined1 local_9a8 [4];
  uint32_t miss_index;
  uint32_t local_7cc;
  undefined1 local_7c8 [4];
  uint32_t sbt_stride;
  uint32_t local_5ec;
  undefined1 local_5e8 [4];
  uint32_t sbt_offset;
  uint32_t local_40c;
  undefined1 local_408 [4];
  uint32_t cull_mask;
  uint32_t local_22c;
  undefined1 local_228 [4];
  uint32_t ray_flags;
  anon_class_1_0_00000001 local_49;
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  local_48;
  uint32_t local_28;
  Op local_24;
  uint32_t result_type;
  Op opcode;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  _result_type = inst;
  inst_local = (Instruction *)_;
  local_24 = Instruction::opcode(inst);
  local_28 = Instruction::type_id(_result_type);
  pIVar1 = inst_local;
  if (local_24 == OpTraceRayKHR) {
    pFVar7 = Instruction::function(_result_type);
    uVar3 = Function::id(pFVar7);
    pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::RayTracingPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_48,&local_49);
    Function::RegisterExecutionModelLimitation(pFVar7,&local_48);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_48);
    pIVar1 = inst_local;
    uVar3 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,0);
    OVar5 = ValidationState_t::GetIdOpcode((ValidationState_t *)pIVar1,uVar3);
    if (OVar5 != OpTypeAccelerationStructureKHR) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_228,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_228,
                          (char (*) [77])
                          "Expected Acceleration Structure to be of type OpTypeAccelerationStructureKHR"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_228);
      return __local._4_4_;
    }
    local_22c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,1);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_22c);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_22c),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_408,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_408,
                          (char (*) [38])"Ray Flags must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_408);
      return __local._4_4_;
    }
    local_40c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,2);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_40c);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_40c),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_5e8,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_5e8,
                          (char (*) [38])"Cull Mask must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_5e8);
      return __local._4_4_;
    }
    local_5ec = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,3);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_5ec);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_5ec),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_7c8,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_7c8,
                          (char (*) [39])"SBT Offset must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7c8);
      return __local._4_4_;
    }
    local_7cc = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,4);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_7cc);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_7cc),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_9a8,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_9a8,
                          (char (*) [39])"SBT Stride must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_9a8);
      return __local._4_4_;
    }
    local_9ac = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,5);
    bVar2 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_9ac);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_9ac),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_b88,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_b88,
                          (char (*) [39])"Miss Index must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_b88);
      return __local._4_4_;
    }
    local_b8c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,6);
    bVar2 = ValidationState_t::IsFloatVectorType((ValidationState_t *)inst_local,local_b8c);
    if (((!bVar2) ||
        (uVar3 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_b8c),
        uVar3 != 3)) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_b8c),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_d68,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_d68,
                          (char (*) [53])"Ray Origin must be a 32-bit float 3-component vector");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_d68);
      return __local._4_4_;
    }
    local_d6c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,7);
    bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_d6c);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_d6c),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_f48,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_f48,
                          (char (*) [39])"Ray TMin must be a 32-bit float scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_f48);
      return __local._4_4_;
    }
    local_f4c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,8);
    bVar2 = ValidationState_t::IsFloatVectorType((ValidationState_t *)inst_local,local_f4c);
    if (((!bVar2) ||
        (uVar3 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_f4c),
        uVar3 != 3)) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_f4c),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_1128,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1128,
                          (char (*) [56])"Ray Direction must be a 32-bit float 3-component vector");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1128);
      return __local._4_4_;
    }
    local_112c = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,9)
    ;
    bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_112c);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_112c),
       pIVar1 = inst_local, uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&payload,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA
                 ,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&payload,
                          (char (*) [39])"Ray TMax must be a 32-bit float scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&payload);
      return __local._4_4_;
    }
    uVar4 = Instruction::GetOperandAs<unsigned_int>(_result_type,10);
    local_1310 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
    OVar5 = Instruction::opcode(local_1310);
    if (OVar5 != OpVariable) {
      ValidationState_t::diag
                (&local_14e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_14e8,(char (*) [43])"Payload must be the result of a OpVariable");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_14e8);
      return __local._4_4_;
    }
    SVar6 = Instruction::GetOperandAs<spv::StorageClass>(local_1310,2);
    if ((SVar6 != RayPayloadKHR) &&
       (SVar6 = Instruction::GetOperandAs<spv::StorageClass>(local_1310,2),
       SVar6 != IncomingRayPayloadKHR)) {
      ValidationState_t::diag
                (&local_16c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_16c0,
                          (char (*) [71])
                          "Payload must have storage class RayPayloadKHR or IncomingRayPayloadKHR");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_16c0);
      return __local._4_4_;
    }
  }
  else if (local_24 == OpExecuteCallableKHR) {
    pFVar7 = Instruction::function(_result_type);
    uVar3 = Function::id(pFVar7);
    pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::RayTracingPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__2,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&sbt_index,&local_1ca1);
    Function::RegisterExecutionModelLimitation
              (pFVar7,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                       *)&sbt_index);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function((function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                 *)&sbt_index);
    local_1ca8 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,0)
    ;
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_1ca8);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_1ca8),
       pIVar1 = inst_local, uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&callable_data,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&callable_data,
                          (char (*) [47])"SBT Index must be a 32-bit unsigned int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&callable_data);
      return __local._4_4_;
    }
    uVar4 = Instruction::GetOperandAs<unsigned_int>(_result_type,1);
    local_1e88 = ValidationState_t::FindDef((ValidationState_t *)pIVar1,uVar4);
    OVar5 = Instruction::opcode(local_1e88);
    if (OVar5 != OpVariable) {
      ValidationState_t::diag
                (&local_2060,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_2060,
                          (char (*) [49])"Callable Data must be the result of a OpVariable");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_2060);
      return __local._4_4_;
    }
    SVar6 = Instruction::GetOperandAs<spv::StorageClass>(local_1e88,2);
    if ((SVar6 != CallableDataKHR) &&
       (SVar6 = Instruction::GetOperandAs<spv::StorageClass>(local_1e88,2),
       SVar6 != IncomingCallableDataKHR)) {
      ValidationState_t::diag
                (&local_2238,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_2238,
                          (char (*) [81])
                          "Callable Data must have storage class CallableDataKHR or IncomingCallableDataKHR"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_2238);
      return __local._4_4_;
    }
  }
  else if (local_24 == OpReportIntersectionKHR) {
    pFVar7 = Instruction::function(_result_type);
    uVar3 = Function::id(pFVar7);
    pFVar7 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar3);
    std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
    function<spvtools::val::RayTracingPass(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1,void>
              ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_16e0,&local_16e1)
    ;
    Function::RegisterExecutionModelLimitation(pFVar7,&local_16e0);
    std::
    function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
    ::~function(&local_16e0);
    bVar2 = ValidationState_t::IsBoolScalarType((ValidationState_t *)inst_local,local_28);
    if (!bVar2) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_18c0,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<((DiagnosticStream *)local_18c0,(char (*) [44])0x3d033a);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_18c0);
      return __local._4_4_;
    }
    local_18c4 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,2)
    ;
    bVar2 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_18c4);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_18c4),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_1aa0,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_1aa0,
                          (char (*) [32])"Hit must be a 32-bit int scalar");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_1aa0);
      return __local._4_4_;
    }
    local_1aa4 = ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_type,3)
    ;
    bVar2 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_1aa4);
    if ((!bVar2) ||
       (uVar3 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_1aa4),
       uVar3 != 0x20)) {
      ValidationState_t::diag
                (&local_1c80,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_type);
      pDVar8 = DiagnosticStream::operator<<
                         (&local_1c80,(char (*) [46])"Hit Kind must be a 32-bit unsigned int scalar"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar8);
      DiagnosticStream::~DiagnosticStream(&local_1c80);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t RayTracingPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpTraceRayKHR: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::RayGenerationKHR &&
                    model != spv::ExecutionModel::ClosestHitKHR &&
                    model != spv::ExecutionModel::MissKHR) {
                  if (message) {
                    *message =
                        "OpTraceRayKHR requires RayGenerationKHR, "
                        "ClosestHitKHR and MissKHR execution models";
                  }
                  return false;
                }
                return true;
              });

      if (_.GetIdOpcode(_.GetOperandTypeId(inst, 0)) !=
          spv::Op::OpTypeAccelerationStructureKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Acceleration Structure to be of type "
                  "OpTypeAccelerationStructureKHR";
      }

      const uint32_t ray_flags = _.GetOperandTypeId(inst, 1);
      if (!_.IsIntScalarType(ray_flags) || _.GetBitWidth(ray_flags) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Flags must be a 32-bit int scalar";
      }

      const uint32_t cull_mask = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(cull_mask) || _.GetBitWidth(cull_mask) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Cull Mask must be a 32-bit int scalar";
      }

      const uint32_t sbt_offset = _.GetOperandTypeId(inst, 3);
      if (!_.IsIntScalarType(sbt_offset) || _.GetBitWidth(sbt_offset) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "SBT Offset must be a 32-bit int scalar";
      }

      const uint32_t sbt_stride = _.GetOperandTypeId(inst, 4);
      if (!_.IsIntScalarType(sbt_stride) || _.GetBitWidth(sbt_stride) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "SBT Stride must be a 32-bit int scalar";
      }

      const uint32_t miss_index = _.GetOperandTypeId(inst, 5);
      if (!_.IsIntScalarType(miss_index) || _.GetBitWidth(miss_index) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Miss Index must be a 32-bit int scalar";
      }

      const uint32_t ray_origin = _.GetOperandTypeId(inst, 6);
      if (!_.IsFloatVectorType(ray_origin) || _.GetDimension(ray_origin) != 3 ||
          _.GetBitWidth(ray_origin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Origin must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmin = _.GetOperandTypeId(inst, 7);
      if (!_.IsFloatScalarType(ray_tmin) || _.GetBitWidth(ray_tmin) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMin must be a 32-bit float scalar";
      }

      const uint32_t ray_direction = _.GetOperandTypeId(inst, 8);
      if (!_.IsFloatVectorType(ray_direction) ||
          _.GetDimension(ray_direction) != 3 ||
          _.GetBitWidth(ray_direction) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray Direction must be a 32-bit float 3-component vector";
      }

      const uint32_t ray_tmax = _.GetOperandTypeId(inst, 9);
      if (!_.IsFloatScalarType(ray_tmax) || _.GetBitWidth(ray_tmax) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Ray TMax must be a 32-bit float scalar";
      }

      const Instruction* payload = _.FindDef(inst->GetOperandAs<uint32_t>(10));
      if (payload->opcode() != spv::Op::OpVariable) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Payload must be the result of a OpVariable";
      } else if (payload->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::RayPayloadKHR &&
                 payload->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::IncomingRayPayloadKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Payload must have storage class RayPayloadKHR or "
                  "IncomingRayPayloadKHR";
      }
      break;
    }

    case spv::Op::OpReportIntersectionKHR: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::IntersectionKHR) {
                  if (message) {
                    *message =
                        "OpReportIntersectionKHR requires IntersectionKHR "
                        "execution model";
                  }
                  return false;
                }
                return true;
              });

      if (!_.IsBoolScalarType(result_type)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "expected Result Type to be bool scalar type";
      }

      const uint32_t hit = _.GetOperandTypeId(inst, 2);
      if (!_.IsFloatScalarType(hit) || _.GetBitWidth(hit) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit must be a 32-bit int scalar";
      }

      const uint32_t hit_kind = _.GetOperandTypeId(inst, 3);
      if (!_.IsUnsignedIntScalarType(hit_kind) ||
          _.GetBitWidth(hit_kind) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Hit Kind must be a 32-bit unsigned int scalar";
      }
      break;
    }

    case spv::Op::OpExecuteCallableKHR: {
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation([](spv::ExecutionModel model,
                                                std::string* message) {
            if (model != spv::ExecutionModel::RayGenerationKHR &&
                model != spv::ExecutionModel::ClosestHitKHR &&
                model != spv::ExecutionModel::MissKHR &&
                model != spv::ExecutionModel::CallableKHR) {
              if (message) {
                *message =
                    "OpExecuteCallableKHR requires RayGenerationKHR, "
                    "ClosestHitKHR, MissKHR and CallableKHR execution models";
              }
              return false;
            }
            return true;
          });

      const uint32_t sbt_index = _.GetOperandTypeId(inst, 0);
      if (!_.IsUnsignedIntScalarType(sbt_index) ||
          _.GetBitWidth(sbt_index) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "SBT Index must be a 32-bit unsigned int scalar";
      }

      const auto callable_data = _.FindDef(inst->GetOperandAs<uint32_t>(1));
      if (callable_data->opcode() != spv::Op::OpVariable) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Callable Data must be the result of a OpVariable";
      } else if (callable_data->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::CallableDataKHR &&
                 callable_data->GetOperandAs<spv::StorageClass>(2) !=
                     spv::StorageClass::IncomingCallableDataKHR) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Callable Data must have storage class CallableDataKHR or "
                  "IncomingCallableDataKHR";
      }

      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}